

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

void __thiscall cmSourceFileLocation::DirectoryUseSource(cmSourceFileLocation *this)

{
  string *in_base;
  string sStack_38;
  
  if (this->Makefile != (cmMakefile *)0x0) {
    if (this->AmbiguousDirectory == true) {
      in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&sStack_38,&this->Directory,in_base);
      std::__cxx11::string::operator=((string *)&this->Directory,(string *)&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
      this->AmbiguousDirectory = false;
    }
    return;
  }
  __assert_fail("this->Makefile",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSourceFileLocation.cxx"
                ,0x47,"void cmSourceFileLocation::DirectoryUseSource()");
}

Assistant:

void cmSourceFileLocation::DirectoryUseSource()
{
  assert(this->Makefile);
  if (this->AmbiguousDirectory) {
    this->Directory = cmSystemTools::CollapseFullPath(
      this->Directory, this->Makefile->GetCurrentSourceDirectory());
    this->AmbiguousDirectory = false;
  }
}